

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_impl.h
# Opt level: O0

int secp256k1_scalar_set_b32_seckey(secp256k1_scalar *r,uchar *bin)

{
  int iVar1;
  int *in_RSI;
  uchar *in_RDI;
  int overflow;
  secp256k1_scalar *unaff_retaddr;
  undefined4 local_14;
  
  secp256k1_scalar_set_b32(unaff_retaddr,in_RDI,in_RSI);
  secp256k1_scalar_verify((secp256k1_scalar *)0x103e7c);
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x103e98);
  return (uint)((local_14 != 0 ^ 0xffU) & 1 & (iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_scalar_set_b32_seckey(secp256k1_scalar *r, const unsigned char *bin) {
    int overflow;
    secp256k1_scalar_set_b32(r, bin, &overflow);

    SECP256K1_SCALAR_VERIFY(r);
    return (!overflow) & (!secp256k1_scalar_is_zero(r));
}